

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O2

S2Cap * __thiscall S2Cell::GetCapBound(S2Cap *__return_storage_ptr__,S2Cell *this)

{
  char cVar1;
  int k;
  int k_00;
  S2Point center;
  R2Point local_68;
  BasicVector<Vector3,_double,_3UL> local_58 [24];
  D local_40;
  
  cVar1 = this->face_;
  local_68 = R2Rect::GetCenter(&this->uv_);
  S2::FaceUVtoXYZ((S2Point *)local_58,(int)cVar1,&local_68);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize(&local_40,local_58);
  S2Cap::FromPoint(__return_storage_ptr__,&local_40);
  for (k_00 = 0; k_00 != 4; k_00 = k_00 + 1) {
    GetVertex((S2Point *)local_58,this,k_00);
    S2Cap::AddPoint(__return_storage_ptr__,(S2Point *)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2Cell::GetCapBound() const {
  // Use the cell center in (u,v)-space as the cap axis.  This vector is
  // very close to GetCenter() and faster to compute.  Neither one of these
  // vectors yields the bounding cap with minimal surface area, but they
  // are both pretty close.
  //
  // It's possible to show that the two vertices that are furthest from
  // the (u,v)-origin never determine the maximum cap size (this is a
  // possible future optimization).

  S2Point center = S2::FaceUVtoXYZ(face_, uv_.GetCenter()).Normalize();
  S2Cap cap = S2Cap::FromPoint(center);
  for (int k = 0; k < 4; ++k) {
    cap.AddPoint(GetVertex(k));
  }
  return cap;
}